

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O1

SparseMatrix<double,_0,_int> * __thiscall
Eigen::SparseMatrix<double,0,int>::operator=
          (SparseMatrix<double,0,int> *this,
          SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_> *other)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  Index IVar4;
  Index IVar5;
  long lVar6;
  void *__ptr;
  Index *pIVar7;
  Index *pIVar8;
  Scalar_conflict *pSVar9;
  Index *pIVar10;
  size_t sVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  int iVar14;
  long lVar15;
  void *__ptr_00;
  undefined8 *puVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 local_78 [8];
  SparseMatrix<double,_0,_int> dest;
  
  local_78[0] = false;
  stack0xffffffffffffff8c = 0;
  dest.m_innerSize = 0;
  dest._12_4_ = 0;
  dest.m_outerIndex = (Index *)0x0;
  dest.m_innerNonZeros = (Index *)0x0;
  dest.m_data.m_values = (Scalar_conflict *)0x0;
  dest.m_data.m_indices = (Index *)0x0;
  dest.m_data.m_size = 0;
  SparseMatrix<double,_0,_int>::resize
            ((SparseMatrix<double,_0,_int> *)local_78,*(Index *)(other + 4),*(Index *)(other + 8));
  uVar13 = dest._8_8_;
  dest.m_data.m_allocatedSize = (size_t)(int)local_78._4_4_;
  if ((long)dest.m_data.m_allocatedSize < 0) {
    __assert_fail("vecSize >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/MapBase.h"
                  ,0x8a,
                  "Eigen::MapBase<Eigen::Map<Eigen::Matrix<int, -1, 1>>, 0>::MapBase(PointerType, Index) [Derived = Eigen::Map<Eigen::Matrix<int, -1, 1>>, Level = 0]"
                 );
  }
  uVar22 = dest.m_data.m_allocatedSize;
  if (((dest._8_8_ & 3) == 0) &&
     (uVar22 = (ulong)(-((uint)((ulong)dest._8_8_ >> 2) & 0x3fffffff) & 3),
     (long)dest.m_data.m_allocatedSize <= (long)uVar22)) {
    uVar22 = dest.m_data.m_allocatedSize;
  }
  uVar23 = dest.m_data.m_allocatedSize - uVar22;
  uVar17 = uVar23 + 3;
  if (-1 < (long)uVar23) {
    uVar17 = uVar23;
  }
  if (0 < (long)uVar22) {
    memset((void *)dest._8_8_,0,uVar22 * 4);
  }
  lVar18 = (uVar17 & 0xfffffffffffffffc) + uVar22;
  if (3 < (long)uVar23) {
    lVar15 = uVar22 + 4;
    if ((long)(uVar22 + 4) < lVar18) {
      lVar15 = lVar18;
    }
    memset((void *)(uVar13 + uVar22 * 4),0,(~uVar22 + lVar15 & 0xfffffffffffffffc) * 4 + 0x10);
  }
  if (dest.m_data.m_allocatedSize - lVar18 != 0 && lVar18 <= (long)dest.m_data.m_allocatedSize) {
    memset((void *)(uVar13 + ((long)uVar17 >> 2) * 0x10 + uVar22 * 4),0,
           (dest.m_data.m_allocatedSize - lVar18) * 4);
  }
  if (0 < *(int *)(other + 4)) {
    lVar18 = *(long *)(other + 0x28);
    lVar15 = *(long *)(other + 0x10);
    lVar6 = *(long *)(other + 0x18);
    lVar19 = 0;
    do {
      iVar14 = *(int *)(lVar15 + lVar19 * 4);
      lVar20 = (long)iVar14;
      if (lVar6 == 0) {
        iVar21 = *(int *)(lVar15 + 4 + lVar19 * 4);
      }
      else {
        iVar21 = *(int *)(lVar6 + lVar19 * 4) + iVar14;
      }
      if (iVar14 < iVar21) {
        do {
          piVar1 = (int *)(dest._8_8_ + (long)*(int *)(lVar18 + lVar20 * 4) * 4);
          *piVar1 = *piVar1 + 1;
          lVar20 = lVar20 + 1;
        } while (iVar21 != lVar20);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < *(int *)(other + 4));
  }
  uVar12 = local_78._4_4_;
  uVar22 = stack0xffffffffffffff8c & 0xffffffff;
  if (uVar22 == 0) {
    __ptr_00 = (void *)0x0;
  }
  else if (((int)local_78._4_4_ < 0) || (__ptr_00 = malloc(uVar22 * 4), __ptr_00 == (void *)0x0)) {
    puVar16 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar16 = std::streambuf::xsgetn;
    __cxa_throw(puVar16,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if ((int)uVar12 < 0) {
    __assert_fail("dim >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Matrix.h"
                  ,0xe1,
                  "Eigen::Matrix<int, -1, 1>::Matrix(Index) [_Scalar = int, _Rows = -1, _Cols = 1, _Options = 0, _MaxRows = -1, _MaxCols = 1]"
                 );
  }
  if ((int)local_78._4_4_ < 1) {
    iVar14 = 0;
  }
  else {
    uVar17 = 0;
    iVar14 = 0;
    do {
      iVar21 = *(int *)(dest._8_8_ + uVar17 * 4);
      *(int *)(dest._8_8_ + uVar17 * 4) = iVar14;
      if (uVar22 == uVar17) {
LAB_00148ab9:
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x17a,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
                     );
      }
      *(int *)((long)__ptr_00 + uVar17 * 4) = iVar14;
      iVar14 = iVar14 + iVar21;
      uVar17 = uVar17 + 1;
    } while ((long)uVar17 < (long)(int)local_78._4_4_);
  }
  *(int *)(dest._8_8_ + (long)(int)local_78._4_4_ * 4) = iVar14;
  internal::CompressedStorage<double,_int>::resize
            ((CompressedStorage<double,_int> *)&dest.m_innerNonZeros,(long)iVar14,0.0);
  if (0 < *(int *)(other + 4)) {
    dest.m_data.m_allocatedSize = *(size_t *)(other + 0x20);
    lVar18 = *(long *)(other + 0x28);
    lVar15 = *(long *)(other + 0x10);
    lVar6 = *(long *)(other + 0x18);
    lVar19 = 0;
    do {
      iVar14 = *(int *)(lVar15 + lVar19 * 4);
      if (lVar6 == 0) {
        iVar21 = *(int *)(lVar15 + 4 + lVar19 * 4);
      }
      else {
        iVar21 = *(int *)(lVar6 + lVar19 * 4) + iVar14;
      }
      if (iVar14 < iVar21) {
        lVar20 = 0;
        do {
          uVar2 = *(uint *)(lVar18 + (long)iVar14 * 4 + lVar20 * 4);
          if ((uint)uVar12 <= uVar2) goto LAB_00148ab9;
          iVar3 = *(int *)((long)__ptr_00 + (long)(int)uVar2 * 4);
          *(int *)((long)__ptr_00 + (long)(int)uVar2 * 4) = iVar3 + 1;
          *(int *)((long)dest.m_data.m_values + (long)iVar3 * 4) = (int)lVar19;
          *(undefined8 *)(dest.m_innerNonZeros + (long)iVar3 * 2) =
               *(undefined8 *)(dest.m_data.m_allocatedSize + (long)iVar14 * 8 + lVar20 * 8);
          lVar20 = lVar20 + 1;
        } while (iVar21 - iVar14 != (int)lVar20);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < *(int *)(other + 4));
  }
  __ptr = *(void **)(this + 0x10);
  *(undefined8 *)(this + 0x10) = dest._8_8_;
  IVar4 = *(Index *)(this + 8);
  *(undefined4 *)(this + 8) = dest._0_4_;
  IVar5 = *(Index *)(this + 4);
  *(undefined4 *)(this + 4) = local_78._4_4_;
  dest._0_4_ = IVar4;
  local_78._4_4_ = IVar5;
  pIVar7 = *(Index **)(this + 0x18);
  *(Index **)(this + 0x18) = dest.m_outerIndex;
  pIVar8 = *(Index **)(this + 0x20);
  *(Index **)(this + 0x20) = dest.m_innerNonZeros;
  pSVar9 = *(Scalar_conflict **)(this + 0x28);
  *(Scalar_conflict **)(this + 0x28) = dest.m_data.m_values;
  pIVar10 = *(Index **)(this + 0x30);
  *(Index **)(this + 0x30) = dest.m_data.m_indices;
  sVar11 = *(size_t *)(this + 0x38);
  *(size_t *)(this + 0x38) = dest.m_data.m_size;
  dest._8_8_ = __ptr;
  dest.m_outerIndex = pIVar7;
  dest.m_innerNonZeros = pIVar8;
  dest.m_data.m_values = pSVar9;
  dest.m_data.m_indices = pIVar10;
  dest.m_data.m_size = sVar11;
  free(__ptr_00);
  free(__ptr);
  free(dest.m_outerIndex);
  internal::CompressedStorage<double,_int>::~CompressedStorage
            ((CompressedStorage<double,_int> *)&dest.m_innerNonZeros);
  return (SparseMatrix<double,_0,_int> *)this;
}

Assistant:

EIGEN_DONT_INLINE SparseMatrix<Scalar,_Options,_Index>& SparseMatrix<Scalar,_Options,_Index>::operator=(const SparseMatrixBase<OtherDerived>& other)
{
  EIGEN_STATIC_ASSERT((internal::is_same<Scalar, typename OtherDerived::Scalar>::value),
        YOU_MIXED_DIFFERENT_NUMERIC_TYPES__YOU_NEED_TO_USE_THE_CAST_METHOD_OF_MATRIXBASE_TO_CAST_NUMERIC_TYPES_EXPLICITLY)
  
  const bool needToTranspose = (Flags & RowMajorBit) != (OtherDerived::Flags & RowMajorBit);
  if (needToTranspose)
  {
    // two passes algorithm:
    //  1 - compute the number of coeffs per dest inner vector
    //  2 - do the actual copy/eval
    // Since each coeff of the rhs has to be evaluated twice, let's evaluate it if needed
    typedef typename internal::nested<OtherDerived,2>::type OtherCopy;
    typedef typename internal::remove_all<OtherCopy>::type _OtherCopy;
    OtherCopy otherCopy(other.derived());

    SparseMatrix dest(other.rows(),other.cols());
    Eigen::Map<Matrix<Index, Dynamic, 1> > (dest.m_outerIndex,dest.outerSize()).setZero();

    // pass 1
    // FIXME the above copy could be merged with that pass
    for (Index j=0; j<otherCopy.outerSize(); ++j)
      for (typename _OtherCopy::InnerIterator it(otherCopy, j); it; ++it)
        ++dest.m_outerIndex[it.index()];

    // prefix sum
    Index count = 0;
    Matrix<Index,Dynamic,1> positions(dest.outerSize());
    for (Index j=0; j<dest.outerSize(); ++j)
    {
      Index tmp = dest.m_outerIndex[j];
      dest.m_outerIndex[j] = count;
      positions[j] = count;
      count += tmp;
    }
    dest.m_outerIndex[dest.outerSize()] = count;
    // alloc
    dest.m_data.resize(count);
    // pass 2
    for (Index j=0; j<otherCopy.outerSize(); ++j)
    {
      for (typename _OtherCopy::InnerIterator it(otherCopy, j); it; ++it)
      {
        Index pos = positions[it.index()]++;
        dest.m_data.index(pos) = j;
        dest.m_data.value(pos) = it.value();
      }
    }
    this->swap(dest);
    return *this;
  }
  else
  {
    if(other.isRValue())
      initAssignment(other.derived());
    // there is no special optimization
    return Base::operator=(other.derived());
  }
}